

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialnonce.cpp
# Opt level: O0

void __thiscall
ConfidentialNonce_Constractor_bytedata0_Test::TestBody
          (ConfidentialNonce_Constractor_bytedata0_Test *this)

{
  bool bVar1;
  byte bVar2;
  char *pcVar3;
  AssertHelper local_110;
  Message local_108;
  bool local_fa;
  bool local_f9;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar_2;
  Message local_e0;
  int local_d4;
  ByteData local_d0;
  unsigned_long local_b8;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_1;
  Message local_98;
  string local_90 [32];
  undefined1 local_70 [8];
  AssertionResult gtest_ar;
  undefined1 local_50 [8];
  ConfidentialNonce nonce;
  ByteData bytedata;
  ConfidentialNonce_Constractor_bytedata0_Test *this_local;
  
  cfd::core::ByteData::ByteData((ByteData *)&nonce.version_);
  cfd::core::ConfidentialNonce::ConfidentialNonce
            ((ConfidentialNonce *)local_50,(ByteData *)&nonce.version_);
  cfd::core::ConfidentialNonce::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ((internal *)local_70,"nonce.GetHex().c_str()","\"\"",pcVar3,"");
  std::__cxx11::string::~string(local_90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_70);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialnonce.cpp"
               ,0x4b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  cfd::core::ConfidentialNonce::GetData();
  local_b8 = cfd::core::ByteData::GetDataSize();
  local_d4 = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_b0,"nonce.GetData().GetDataSize()","0",&local_b8,&local_d4);
  cfd::core::ByteData::~ByteData(&local_d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_e0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialnonce.cpp"
               ,0x4c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  bVar2 = cfd::core::ConfidentialNonce::HasBlinding();
  local_f9 = (bool)(bVar2 & 1);
  local_fa = false;
  testing::internal::EqHelper<false>::Compare<bool,bool>
            ((EqHelper<false> *)local_f8,"nonce.HasBlinding()","false",&local_f9,&local_fa);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar1) {
    testing::Message::Message(&local_108);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialnonce.cpp"
               ,0x4d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_110,&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    testing::Message::~Message(&local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  cfd::core::ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)local_50);
  cfd::core::ByteData::~ByteData((ByteData *)&nonce.version_);
  return;
}

Assistant:

TEST(ConfidentialNonce, Constractor_bytedata0) {
  // 0byte
  ByteData bytedata;
  ConfidentialNonce nonce(bytedata);
  EXPECT_STREQ(nonce.GetHex().c_str(), "");
  EXPECT_EQ(nonce.GetData().GetDataSize(), 0);
  EXPECT_EQ(nonce.HasBlinding(), false);
}